

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O3

void __thiscall
absl::lts_20250127::log_internal::LogMessage::
CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
          (LogMessage *this,string_view str)

{
  LogMessageData *pLVar1;
  ulong uVar2;
  size_type *psVar3;
  bool bVar4;
  Span<char> *in_R8;
  LogMessageData *this_00;
  Span<char> msg;
  Span<const_char> value;
  Span<char> encoded_remaining_copy;
  Span<char> local_48;
  
  pLVar1 = (this->data_)._M_t.
           super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           ._M_t.
           super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
           .
           super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
           ._M_head_impl;
  if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
    LogMessageData::InitializeEncodingAndFormat(pLVar1);
  }
  local_48.ptr_ = (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_;
  local_48.len_ = (pLVar1->encoded_remaining_actual_do_not_use_directly).len_;
  msg = EncodeMessageStart(7,(uint64_t)((pointer)str._M_len + 0xb),&local_48);
  value.len_ = (size_type)&local_48;
  value.ptr_ = (pointer)str._M_len;
  bVar4 = EncodeBytesTruncate((log_internal *)0x6,(uint64_t)str._M_str,value,in_R8);
  if (bVar4) {
    EncodeMessageLength(msg,&local_48);
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
      (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar1);
    }
    (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = local_48.ptr_;
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = local_48.len_;
  }
  else {
    pLVar1 = (this->data_)._M_t.
             super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             ._M_t.
             super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
             .
             super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
             ._M_head_impl;
    this_00 = pLVar1;
    if ((pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
      (pLVar1->encoded_remaining_actual_do_not_use_directly).ptr_ = (pLVar1->encoded_buf)._M_elems;
      (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
      LogMessageData::InitializeEncodingAndFormat(pLVar1);
      this_00 = (this->data_)._M_t.
                super___uniq_ptr_impl<absl::lts_20250127::log_internal::LogMessage::LogMessageData,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                ._M_t.
                super__Tuple_impl<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_std::default_delete<absl::lts_20250127::log_internal::LogMessage::LogMessageData>_>
                .
                super__Head_base<0UL,_absl::lts_20250127::log_internal::LogMessage::LogMessageData_*,_false>
                ._M_head_impl;
      if ((this_00->encoded_remaining_actual_do_not_use_directly).ptr_ == (pointer)0x0) {
        (this_00->encoded_remaining_actual_do_not_use_directly).ptr_ =
             (this_00->encoded_buf)._M_elems;
        (this_00->encoded_remaining_actual_do_not_use_directly).len_ = 15000;
        LogMessageData::InitializeEncodingAndFormat(this_00);
      }
    }
    uVar2 = (pLVar1->encoded_remaining_actual_do_not_use_directly).len_;
    psVar3 = &(this_00->encoded_remaining_actual_do_not_use_directly).len_;
    if (uVar2 < *psVar3) {
      __assert_fail("false && \"size() >= n\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/_deps/absl-src/absl/types/span.h"
                    ,0x1b5,
                    "auto absl::Span<char>::remove_suffix(size_type)::(anonymous class)::operator()() const [T = char]"
                   );
    }
    (pLVar1->encoded_remaining_actual_do_not_use_directly).len_ = uVar2 - *psVar3;
  }
  return;
}

Assistant:

void LogMessage::CopyToEncodedBuffer(absl::string_view str) {
  auto encoded_remaining_copy = data_->encoded_remaining();
  constexpr uint8_t tag_value = str_type == StringType::kLiteral
                                    ? ValueTag::kStringLiteral
                                    : ValueTag::kString;
  auto start = EncodeMessageStart(
      EventTag::kValue,
      BufferSizeFor(tag_value, WireType::kLengthDelimited) + str.size(),
      &encoded_remaining_copy);
  // If the `logging.proto.Event.value` field header did not fit,
  // `EncodeMessageStart` will have zeroed `encoded_remaining_copy`'s size and
  // `EncodeStringTruncate` will fail too.
  if (EncodeStringTruncate(tag_value, str, &encoded_remaining_copy)) {
    // The string may have been truncated, but the field header fit.
    EncodeMessageLength(start, &encoded_remaining_copy);
    data_->encoded_remaining() = encoded_remaining_copy;
  } else {
    // The field header(s) did not fit; zero `encoded_remaining()` so we don't
    // write anything else later.
    data_->encoded_remaining().remove_suffix(data_->encoded_remaining().size());
  }
}